

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  char *rhs_expression;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_bucknum;
  key_type *in_stack_fffffffffffffe68;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe70;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  int iVar3;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe90;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  AssertionResult local_130;
  Message *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_100 [2];
  key_type local_e0;
  size_type local_d8;
  AssertionResult local_d0 [6];
  undefined1 local_68 [16];
  value_type *in_stack_ffffffffffffffa8;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffffb0;
  key_type local_18;
  type local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_18 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  local_10 = (type)google::
                   BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(uint *)in_stack_fffffffffffffe78,
             (unsigned_long *)in_stack_fffffffffffffe70);
  iVar3 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xc932cc);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffe90,iVar3,in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0xc93329);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9339a);
  pcVar2 = (char *)(in_RDI + 0x10);
  this_02 = (HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_68;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xc933e8);
  rhs_expression = (char *)(in_RDI + 0x10);
  local_e0 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(this_02,(int)((ulong)pcVar2 >> 0x20));
  local_d8 = google::
             BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,(unsigned_long *)in_stack_fffffffffffffe78,
             (unsigned_long *)in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe78 =
         (HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc934bc);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_02,(int)((ulong)pcVar2 >> 0x20),rhs_expression);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0xc93519);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc93587);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_size(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,(uint *)in_stack_fffffffffffffe78,
             (unsigned_long *)in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe70 =
         (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc93621);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_02,(int)((ulong)pcVar2 >> 0x20),rhs_expression);
    testing::internal::AssertHelper::operator=(this_01,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0xc93675);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc936e0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,(uint *)in_stack_fffffffffffffe78,
             (unsigned_long *)in_stack_fffffffffffffe70);
  iVar3 = (int)((ulong)pcVar2 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0xc93766);
    testing::internal::AssertHelper::AssertHelper(this_00,type,(char *)this_02,iVar3,rhs_expression)
    ;
    testing::internal::AssertHelper::operator=(this_01,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0xc937b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc93814);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}